

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infer.cpp
# Opt level: O0

tensor_t<float> * loadImageAsTensor(string *file_name)

{
  byte bVar1;
  undefined2 uVar2;
  long lVar3;
  bool bVar4;
  tensor_t<float> *this;
  runtime_error *this_00;
  tensor_t<float> *in_RDI;
  RGB rgb_ij;
  int j;
  int i;
  RGB *rgb;
  uint8_t *usable;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  tensor_t<float> *image;
  string *in_stack_000001e8;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  tensor_t<float> *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  byte local_58;
  byte bStack_57;
  int local_54;
  int local_50;
  uint in_stack_ffffffffffffffc4;
  
  readFile(in_stack_000001e8);
  bVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffff90);
  if (bVar4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Could not open image.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (tensor_t<float> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10d64c);
  while (*(int *)&(this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 0xa353532) {
    this = (tensor_t<float> *)
           ((long)&(this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
  }
  tensor_t<float>::tensor_t
            (this,(int)((ulong)this >> 0x20),(int)this,in_stack_ffffffffffffffc4 & 0xffffff);
  for (local_50 = 0; local_50 < 0x1c; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < 0x1c; local_54 = local_54 + 1) {
      lVar3 = (long)(local_50 * 0x1c + local_54) * 3;
      bVar1 = *(byte *)((long)&(this->data).super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3 + 2);
      uVar2 = *(undefined2 *)
               ((long)&(this->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3);
      local_58 = (byte)uVar2;
      bStack_57 = (byte)((ushort)uVar2 >> 8);
      in_stack_ffffffffffffff90 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           tensor_t<float>::operator()
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                      0);
      *(float *)&(in_stack_ffffffffffffff90->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start =
           ((float)local_58 + (float)bStack_57 + (float)bVar1) * 0.0013071896;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

tensor_t<float> loadImageAsTensor(const std::string &file_name) {
  // Read the test image for inference
  auto data = readFile(file_name);

  // If the image was loaded
  if (!data.empty()) {

    // Iterate over the image data until we find the actual pixel
    uint8_t *usable = data.data();
    while (*(uint32_t *) usable != 0x0A353532)
      usable++;

#pragma pack(push, 1)
    struct RGB {
      uint8_t r, g, b;
    };
#pragma pack(pop)

    RGB *rgb = (RGB *) usable;

    // Pre-processing for the test image
    tensor_t<float> image(28, 28, 1);
    for (int i = 0; i < 28; i++) {
      for (int j = 0; j < 28; j++) {
        RGB rgb_ij = rgb[i * 28 + j];
        image(j, i, 0) = (((float) rgb_ij.r
            + rgb_ij.g
            + rgb_ij.b)
            / (3.0f * 255.f));
      }
    }
    return image;
  } else {
    throw std::runtime_error("Could not open image.");
  }
}